

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O1

void compute_coord(int num_dims,int *strip_sizes,int target_rank,int *coord,int *dim_order,
                  bool *flipped_dim)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  if (0 < num_dims) {
    lVar1 = (ulong)(uint)num_dims - 1;
    uVar7 = 0;
    lVar8 = lVar1;
    iVar4 = target_rank;
    lVar5 = (long)(num_dims + -1);
    do {
      while ((long)uVar7 < lVar5) {
        piVar2 = dim_order + lVar8;
        lVar8 = lVar8 + -1;
        iVar4 = iVar4 / strip_sizes[*piVar2];
        lVar5 = lVar8;
      }
      iVar3 = dim_order[uVar7];
      uVar6 = iVar4 % strip_sizes[iVar3];
      if (flipped_dim[iVar3] == false) {
        coord[iVar3] = coord[iVar3] + uVar6;
      }
      else {
        coord[iVar3] = coord[iVar3] + strip_sizes[iVar3] + ~uVar6;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar1;
      iVar4 = target_rank;
      lVar5 = (long)(num_dims + -1);
    } while (uVar7 != (uint)num_dims);
  }
  return;
}

Assistant:

void compute_coord(int num_dims, const int *strip_sizes, int target_rank, int *coord, const int *dim_order,
				   const bool *flipped_dim) {
  int curr_dim;
  for (int dim_index = 0; dim_index < num_dims; dim_index++) {
	curr_dim = dim_order[dim_index];
	int coord_component = target_rank;
	int strip_size = strip_sizes[curr_dim];

	for (int rem_dim_index = num_dims - 1; rem_dim_index > dim_index; rem_dim_index--) {
	  int rem_dim = dim_order[rem_dim_index];
	  coord_component /= strip_sizes[rem_dim];
	}

	if (flipped_dim[curr_dim]) {
	  coord[curr_dim] += strip_size - ((coord_component % strip_size) + 1);
	} else {
	  coord[curr_dim] += coord_component % strip_size;
	}
  }
}